

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O2

int trie_get_children(trie_node *root_node,trie_node ***array,uint *len)

{
  long lVar1;
  trie_node *ptVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar2 = root_node->lchild;
  if (ptVar2 == (trie_node *)0x0) {
LAB_00112ebb:
    ptVar2 = root_node->rchild;
    iVar3 = 0;
    if (ptVar2 == (trie_node *)0x0) goto LAB_00112ee3;
    *len = *len + 1;
    iVar3 = append_node_to_array(array,len,ptVar2);
    if ((iVar3 == 0) &&
       (iVar4 = trie_get_children(root_node->rchild,array,len), iVar3 = 0, iVar4 != -1))
    goto LAB_00112ee3;
  }
  else {
    *len = *len + 1;
    iVar3 = append_node_to_array(array,len,ptVar2);
    if ((iVar3 == 0) && (iVar3 = trie_get_children(root_node->lchild,array,len), iVar3 != -1))
    goto LAB_00112ebb;
  }
  lrtr_free(*array);
  iVar3 = -1;
LAB_00112ee3:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

int trie_get_children(const struct trie_node *root_node, struct trie_node ***array, unsigned int *len)
{
	if (root_node->lchild) {
		*len += 1;
		if (append_node_to_array(array, len, root_node->lchild))
			goto err;

		if (trie_get_children(root_node->lchild, array, len) == -1)
			goto err;
	}

	if (root_node->rchild) {
		*len += 1;
		if (append_node_to_array(array, len, root_node->rchild))
			goto err;

		if (trie_get_children(root_node->rchild, array, len) == -1)
			goto err;
	}

	return 0;

err:
	lrtr_free(*array);
	return -1;
}